

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_264_17_dd0fa161 * __thiscall
qclab::qgates::lambda_QGate2<std::complex<double>>
          (anon_class_264_17_dd0fa161 *__return_storage_ptr__,qgates *this,Op op,
          SquareMatrix<std::complex<double>_> *mat2,complex<double> *vector)

{
  complex<double> *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  int64_t iVar31;
  complex<double> *pcVar32;
  undefined7 in_register_00000011;
  SquareMatrix<std::complex<double>_> *this_00;
  SquareMatrix<std::complex<double>_> *local_228;
  anon_class_264_17_dd0fa161 f;
  complex<double> m44;
  complex<double> m43;
  complex<double> m42;
  complex<double> m41;
  complex<double> m34;
  complex<double> m33;
  complex<double> m32;
  complex<double> m31;
  complex<double> m24;
  complex<double> m23;
  complex<double> m22;
  complex<double> m21;
  complex<double> m14;
  complex<double> m13;
  complex<double> m12;
  complex<double> m11;
  complex<double> *vector_local;
  SquareMatrix<std::complex<double>_> *mat2_local;
  Op op_local;
  
  this_00 = (SquareMatrix<std::complex<double>_> *)CONCAT71(in_register_00000011,op);
  iVar31 = dense::SquareMatrix<std::complex<double>_>::size(this_00);
  if (iVar31 == 4) {
    dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>((Op)this,this_00);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,0,0);
    pcVar1 = *(complex<double> **)pcVar32->_M_value;
    uVar2 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,0,1);
    uVar3 = *(undefined8 *)pcVar32->_M_value;
    uVar4 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,0,2);
    uVar5 = *(undefined8 *)pcVar32->_M_value;
    uVar6 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,0,3);
    uVar7 = *(undefined8 *)pcVar32->_M_value;
    uVar8 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,1,0);
    uVar9 = *(undefined8 *)pcVar32->_M_value;
    uVar10 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,1,1);
    uVar11 = *(undefined8 *)pcVar32->_M_value;
    uVar12 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,1,2);
    uVar13 = *(undefined8 *)pcVar32->_M_value;
    uVar14 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,1,3);
    uVar15 = *(undefined8 *)pcVar32->_M_value;
    uVar16 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,2,0);
    uVar17 = *(undefined8 *)pcVar32->_M_value;
    uVar18 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,2,1);
    uVar19 = *(undefined8 *)pcVar32->_M_value;
    uVar20 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,2,2);
    uVar21 = *(undefined8 *)pcVar32->_M_value;
    uVar22 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,2,3);
    uVar23 = *(undefined8 *)pcVar32->_M_value;
    uVar24 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,3,0);
    uVar25 = *(undefined8 *)pcVar32->_M_value;
    uVar26 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,3,1);
    uVar27 = *(undefined8 *)pcVar32->_M_value;
    uVar28 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,3,2);
    uVar29 = *(undefined8 *)pcVar32->_M_value;
    uVar30 = *(undefined8 *)(pcVar32->_M_value + 8);
    pcVar32 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,3,3);
    f.m43._M_value._8_8_ = *(undefined8 *)pcVar32->_M_value;
    f.m44._M_value._0_8_ = *(undefined8 *)(pcVar32->_M_value + 8);
    local_228 = mat2;
    f.vector = pcVar1;
    f.m11._M_value._0_8_ = uVar2;
    f.m11._M_value._8_8_ = uVar3;
    f.m12._M_value._0_8_ = uVar4;
    f.m12._M_value._8_8_ = uVar5;
    f.m13._M_value._0_8_ = uVar6;
    f.m13._M_value._8_8_ = uVar7;
    f.m14._M_value._0_8_ = uVar8;
    f.m14._M_value._8_8_ = uVar9;
    f.m21._M_value._0_8_ = uVar10;
    f.m21._M_value._8_8_ = uVar11;
    f.m22._M_value._0_8_ = uVar12;
    f.m22._M_value._8_8_ = uVar13;
    f.m23._M_value._0_8_ = uVar14;
    f.m23._M_value._8_8_ = uVar15;
    f.m24._M_value._0_8_ = uVar16;
    f.m24._M_value._8_8_ = uVar17;
    f.m31._M_value._0_8_ = uVar18;
    f.m31._M_value._8_8_ = uVar19;
    f.m32._M_value._0_8_ = uVar20;
    f.m32._M_value._8_8_ = uVar21;
    f.m33._M_value._0_8_ = uVar22;
    f.m33._M_value._8_8_ = uVar23;
    f.m34._M_value._0_8_ = uVar24;
    f.m34._M_value._8_8_ = uVar25;
    f.m41._M_value._0_8_ = uVar26;
    f.m41._M_value._8_8_ = uVar27;
    f.m42._M_value._0_8_ = uVar28;
    f.m42._M_value._8_8_ = uVar29;
    f.m43._M_value._0_8_ = uVar30;
    f.m44._M_value._8_8_ = f.m43._M_value._8_8_;
    memcpy(__return_storage_ptr__,&local_228,0x108);
    return __return_storage_ptr__;
  }
  __assert_fail("mat2.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xae,
                "auto qclab::qgates::lambda_QGate2(Op, qclab::dense::SquareMatrix<T>, T *) [T = std::complex<double>]"
               );
}

Assistant:

auto lambda_QGate2( Op op , qclab::dense::SquareMatrix< T > mat2 ,
                      T* vector ) {
    assert( mat2.size() == 4 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat2 ) ;
    const T m11 = mat2( 0 , 0 ) ; const T m12 = mat2( 0 , 1 ) ;
    const T m13 = mat2( 0 , 2 ) ; const T m14 = mat2( 0 , 3 ) ;
    const T m21 = mat2( 1 , 0 ) ; const T m22 = mat2( 1 , 1 ) ;
    const T m23 = mat2( 1 , 2 ) ; const T m24 = mat2( 1 , 3 ) ;
    const T m31 = mat2( 2 , 0 ) ; const T m32 = mat2( 2 , 1 ) ;
    const T m33 = mat2( 2 , 2 ) ; const T m34 = mat2( 2 , 3 ) ;
    const T m41 = mat2( 3 , 0 ) ; const T m42 = mat2( 3 , 1 ) ;
    const T m43 = mat2( 3 , 2 ) ; const T m44 = mat2( 3 , 3 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ,
                   const uint64_t c , const uint64_t d ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      const T x3 = vector[c] ;
      const T x4 = vector[d] ;
      vector[a] = m11 * x1 + m12 * x2 + m13 * x3 + m14 * x4 ;
      vector[b] = m21 * x1 + m22 * x2 + m23 * x3 + m24 * x4 ;
      vector[c] = m31 * x1 + m32 * x2 + m33 * x3 + m34 * x4 ;
      vector[d] = m41 * x1 + m42 * x2 + m43 * x3 + m44 * x4 ;
    } ;
    return f ;
  }